

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O0

int CVmObjClass::s_getp_is_int_class(vm_val_t *result,uint *argc)

{
  int iVar1;
  vm_val_t *pvVar2;
  vm_val_t *in_RDI;
  vm_val_t *v;
  CVmNativeCodeDesc *in_stack_ffffffffffffffb8;
  uint *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  bool bVar3;
  
  if ((s_getp_is_int_class(vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&s_getp_is_int_class(vm_val_t*,unsigned_int*)::desc), iVar1 != 0))
  {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&s_getp_is_int_class::desc,1);
    __cxa_guard_release(&s_getp_is_int_class(vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                     in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (iVar1 == 0) {
    pvVar2 = CVmStack::get(0);
    bVar3 = false;
    if (pvVar2->typ == VM_OBJ) {
      iVar1 = is_intcls_obj(0);
      bVar3 = iVar1 != 0;
    }
    vm_val_t::set_logical(in_RDI,(uint)bVar3);
    CVmStack::discard();
  }
  return 1;
}

Assistant:

int CVmObjClass::s_getp_is_int_class(VMG_ vm_val_t *result, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(result, argc, &desc))
        return TRUE;

    /* return true if we have an object of type intrinsic class */
    vm_val_t *v = G_stk->get(0);
    result->set_logical(v->typ == VM_OBJ && is_intcls_obj(vmg_ v->val.obj));

    /* discard the argument */
    G_stk->discard();

    /* handled */
    return TRUE;
}